

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdCelsiusVtxbufFormat::is_valid_val(MthdCelsiusVtxbufFormat *this)

{
  uint uVar1;
  uint uVar2;
  
  if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 0) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
    uVar2 = uVar1 >> 4 & 7;
    if ((uVar1 >> 0x18 & 1) == 0) {
      if (uVar2 == 4) {
        return false;
      }
    }
    else if (uVar2 == 2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool is_valid_val() override {
		if (idx == 0) {
			int comp = extr(val, 4, 3);
			if (!extr(val, 24, 1)) {
				if (comp == 4)
					return false;
			} else {
				if (comp == 2)
					return false;
			}
		}
		return true;
	}